

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SectionParserManager.cpp
# Opt level: O1

void __thiscall OpenMD::SectionParserManager::~SectionParserManager(SectionParserManager *this)

{
  _List_node_base *p_Var1;
  SectionParserContextList *this_00;
  _List_node_base *p_Var2;
  
  this_00 = &this->sectionParsers_;
  for (p_Var2 = (this->sectionParsers_).
                super__List_base<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>
                ._M_impl._M_node.super__List_node_base._M_next; p_Var2 != (_List_node_base *)this_00
      ; p_Var2 = p_Var2->_M_next) {
    if (p_Var2[1]._M_prev != (_List_node_base *)0x0) {
      (*(code *)(p_Var2[1]._M_prev)->_M_next->_M_prev)();
    }
  }
  std::__cxx11::list<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>::
  clear(this_00);
  p_Var2 = (this_00->
           super__List_base<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  while (p_Var2 != (_List_node_base *)this_00) {
    p_Var1 = p_Var2->_M_next;
    operator_delete(p_Var2,0x40);
    p_Var2 = p_Var1;
  }
  return;
}

Assistant:

SectionParserManager::~SectionParserManager() {
    SectionParserManager::iterator i;
    for (i = sectionParsers_.begin(); i != sectionParsers_.end(); ++i) {
      delete (i->sectionParser);
    }
    sectionParsers_.clear();
  }